

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::dumpwallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff8f8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff900;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  allocator<char> *in_stack_fffffffffffff938;
  iterator in_stack_fffffffffffff940;
  RPCArgOptions *in_stack_fffffffffffff948;
  string *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff960;
  RPCResults *pRVar1;
  string *in_stack_fffffffffffff968;
  RPCResults *pRVar2;
  RPCArg *in_stack_fffffffffffff970;
  RPCResults *in_stack_fffffffffffff978;
  RPCResult *in_stack_fffffffffffff980;
  undefined1 *puVar3;
  undefined1 *local_678;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 uVar4;
  string *description;
  string *in_stack_fffffffffffffa60;
  RPCHelpMan *in_stack_fffffffffffffa68;
  allocator<char> local_55d;
  allocator<char> local_55c;
  allocator<char> local_55b;
  allocator<char> local_55a [2];
  pointer local_558;
  pointer pRStack_550;
  pointer local_548;
  allocator<char> local_532;
  allocator<char> local_531 [31];
  allocator<char> local_512;
  allocator<char> local_511 [32];
  allocator<char> local_4f1 [8];
  allocator<char> local_4e9 [31];
  allocator<char> local_4ca;
  allocator<char> local_4c9 [41];
  undefined8 in_stack_fffffffffffffb60;
  undefined1 local_388 [136];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  RPCResults local_150 [11];
  RPCResults local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  pRVar2 = local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_4f1[1] = (allocator<char>)0x0;
  local_4f1[2] = (allocator<char>)0x0;
  local_4f1[3] = (allocator<char>)0x0;
  local_4f1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff908,(Optional *)in_stack_fffffffffffff900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff910);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff8f8);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                 (Type)((ulong)in_stack_fffffffffffff960 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                 in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  uVar4 = 0;
  pRVar1 = local_150;
  description = (string *)0x1;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff8f8);
  __l._M_len = (size_type)in_stack_fffffffffffff948;
  __l._M_array = in_stack_fffffffffffff940;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff938,__l,
             (allocator_type *)in_stack_fffffffffffff930);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_558 = (pointer)0x0;
  pRStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8f8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff980,(Type)((ulong)in_stack_fffffffffffff978 >> 0x20),
             &in_stack_fffffffffffff970->m_names,in_stack_fffffffffffff968,in_stack_fffffffffffff960
             ,(bool)in_stack_fffffffffffff95f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff8f8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff948;
  __l_00._M_array = (iterator)in_stack_fffffffffffff940;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff938,__l_00,
             (allocator_type *)in_stack_fffffffffffff930);
  RPCResult::RPCResult
            (in_stack_fffffffffffff980,(Type)((ulong)in_stack_fffffffffffff978 >> 0x20),
             &in_stack_fffffffffffff970->m_names,in_stack_fffffffffffff968,in_stack_fffffffffffff960
             ,(bool)in_stack_fffffffffffff95f);
  RPCResults::RPCResults(in_stack_fffffffffffff978,(RPCResult *)in_stack_fffffffffffff970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HelpExampleCli(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HelpExampleRpc(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  std::operator+(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff8f8,(string *)0xc0bb59);
  this = (RPCArg *)&stack0xfffffffffffffa80;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::dumpwallet()::__0,void>(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,description,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)pRVar1,pRVar2,
             (RPCExamples *)CONCAT17(uVar4,in_stack_fffffffffffffa40),
             (RPCMethodImpl *)in_stack_fffffffffffffb60);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_55d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_55c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_55b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_55a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff908);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar3 = local_388;
  local_678 = local_300;
  do {
    local_678 = local_678 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_678 != puVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_532);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_531);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_512);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_511);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  pRVar2 = local_150;
  pRVar1 = local_48;
  do {
    pRVar1 = pRVar1 + -0xb;
    RPCArg::~RPCArg(this);
  } while (pRVar1 != pRVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_4f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_4e9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_4ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_4c9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan dumpwallet()
{
    return RPCHelpMan{"dumpwallet",
                "\nDumps all wallet keys in a human-readable format to a server-side file. This does not allow overwriting existing files.\n"
                "Imported scripts are included in the dumpfile, but corresponding BIP173 addresses, etc. may not be added automatically by importwallet.\n"
                "Note that if your wallet contains keys which are not derived from your HD seed (e.g. imported keys), these are not covered by\n"
                "only backing up the seed itself, and must be backed up too (e.g. ensure you back up the whole dumpfile).\n"
                "Note: This command is only compatible with legacy wallets.\n",
                {
                    {"filename", RPCArg::Type::STR, RPCArg::Optional::NO, "The filename with path (absolute path recommended)"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "filename", "The filename with full absolute path"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("dumpwallet", "\"test\"")
            + HelpExampleRpc("dumpwallet", "\"test\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const CWallet& wallet = *pwallet;
    const LegacyScriptPubKeyMan& spk_man = EnsureConstLegacyScriptPubKeyMan(wallet);

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    EnsureWalletIsUnlocked(wallet);

    fs::path filepath = fs::u8path(request.params[0].get_str());
    filepath = fs::absolute(filepath);

    /* Prevent arbitrary files from being overwritten. There have been reports
     * that users have overwritten wallet files this way:
     * https://github.com/bitcoin/bitcoin/issues/9934
     * It may also avoid other security issues.
     */
    if (fs::exists(filepath)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, filepath.utf8string() + " already exists. If you are sure this is what you want, move it out of the way first");
    }

    std::ofstream file;
    file.open(filepath);
    if (!file.is_open())
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot open wallet dump file");

    std::map<CKeyID, int64_t> mapKeyBirth;
    wallet.GetKeyBirthTimes(mapKeyBirth);

    int64_t block_time = 0;
    CHECK_NONFATAL(wallet.chain().findBlock(wallet.GetLastBlockHash(), FoundBlock().time(block_time)));

    // Note: To avoid a lock order issue, access to cs_main must be locked before cs_KeyStore.
    // So we do the two things in this function that lock cs_main first: GetKeyBirthTimes, and findBlock.
    LOCK(spk_man.cs_KeyStore);

    const std::map<CKeyID, int64_t>& mapKeyPool = spk_man.GetAllReserveKeys();
    std::set<CScriptID> scripts = spk_man.GetCScripts();

    // sort time/key pairs
    std::vector<std::pair<int64_t, CKeyID> > vKeyBirth;
    vKeyBirth.reserve(mapKeyBirth.size());
    for (const auto& entry : mapKeyBirth) {
        vKeyBirth.emplace_back(entry.second, entry.first);
    }
    mapKeyBirth.clear();
    std::sort(vKeyBirth.begin(), vKeyBirth.end());

    // produce output
    file << strprintf("# Wallet dump created by %s %s\n", PACKAGE_NAME, FormatFullVersion());
    file << strprintf("# * Created on %s\n", FormatISO8601DateTime(GetTime()));
    file << strprintf("# * Best block at time of backup was %i (%s),\n", wallet.GetLastBlockHeight(), wallet.GetLastBlockHash().ToString());
    file << strprintf("#   mined on %s\n", FormatISO8601DateTime(block_time));
    file << "\n";

    // add the base58check encoded extended master if the wallet uses HD
    CKeyID seed_id = spk_man.GetHDChain().seed_id;
    if (!seed_id.IsNull())
    {
        CKey seed;
        if (spk_man.GetKey(seed_id, seed)) {
            CExtKey masterKey;
            masterKey.SetSeed(seed);

            file << "# extended private masterkey: " << EncodeExtKey(masterKey) << "\n\n";
        }
    }
    for (std::vector<std::pair<int64_t, CKeyID> >::const_iterator it = vKeyBirth.begin(); it != vKeyBirth.end(); it++) {
        const CKeyID &keyid = it->second;
        std::string strTime = FormatISO8601DateTime(it->first);
        std::string strAddr;
        std::string strLabel;
        CKey key;
        if (spk_man.GetKey(keyid, key)) {
            CKeyMetadata metadata;
            const auto it{spk_man.mapKeyMetadata.find(keyid)};
            if (it != spk_man.mapKeyMetadata.end()) metadata = it->second;
            file << strprintf("%s %s ", EncodeSecret(key), strTime);
            if (GetWalletAddressesForKey(&spk_man, wallet, keyid, strAddr, strLabel)) {
                file << strprintf("label=%s", strLabel);
            } else if (keyid == seed_id) {
                file << "hdseed=1";
            } else if (mapKeyPool.count(keyid)) {
                file << "reserve=1";
            } else if (metadata.hdKeypath == "s") {
                file << "inactivehdseed=1";
            } else {
                file << "change=1";
            }
            file << strprintf(" # addr=%s%s\n", strAddr, (metadata.has_key_origin ? " hdkeypath="+WriteHDKeypath(metadata.key_origin.path, /*apostrophe=*/true) : ""));
        }
    }
    file << "\n";
    for (const CScriptID &scriptid : scripts) {
        CScript script;
        std::string create_time = "0";
        std::string address = EncodeDestination(ScriptHash(scriptid));
        // get birth times for scripts with metadata
        auto it = spk_man.m_script_metadata.find(scriptid);
        if (it != spk_man.m_script_metadata.end()) {
            create_time = FormatISO8601DateTime(it->second.nCreateTime);
        }
        if(spk_man.GetCScript(scriptid, script)) {
            file << strprintf("%s %s script=1", HexStr(script), create_time);
            file << strprintf(" # addr=%s\n", address);
        }
    }
    file << "\n";
    file << "# End of dump\n";
    file.close();

    UniValue reply(UniValue::VOBJ);
    reply.pushKV("filename", filepath.utf8string());

    return reply;
},
    };
}